

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

void pnga_sprs_array_scale(Integer s_a,void *scale)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  undefined1 auVar6 [16];
  double dVar7;
  _sparse_array *p_Var8;
  Integer proc;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  Integer s_hi;
  Integer s_lo;
  void *vptr;
  Integer ld;
  long local_58;
  long local_50;
  undefined1 (*local_48) [16];
  int local_3c;
  Integer local_38;
  
  lVar11 = s_a + 1000;
  proc = pnga_pgroup_nodeid(SPA[s_a + 1000].grp);
  bVar12 = _ga_sync_begin != 0;
  local_3c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar12) {
    pnga_pgroup_sync(SPA[lVar11].grp);
  }
  pnga_distribution(SPA[lVar11].g_data,proc,&local_50,&local_58);
  pnga_access_ptr(SPA[lVar11].g_data,&local_50,&local_58,&local_48,&local_38);
  p_Var8 = SPA;
  switch(SPA[lVar11].type) {
  case 0x3e9:
    if (local_50 <= local_58) {
      iVar5 = *scale;
      lVar9 = 0;
      do {
        *(int *)(*local_48 + lVar9 * 4) = *(int *)(*local_48 + lVar9 * 4) * iVar5;
        lVar9 = lVar9 + 1;
      } while ((local_58 - local_50) + 1 != lVar9);
    }
    break;
  case 0x3ea:
    if (local_50 <= local_58) {
      lVar9 = *scale;
      lVar10 = local_50 + -1;
      do {
        *(long *)((long)local_48 + lVar10 * 8 + local_50 * -8 + 8) =
             *(long *)((long)local_48 + lVar10 * 8 + local_50 * -8 + 8) * lVar9;
        lVar10 = lVar10 + 1;
      } while (lVar10 < local_58);
    }
    break;
  case 0x3eb:
    if (local_50 <= local_58) {
      fVar1 = *scale;
      lVar9 = 0;
      do {
        *(float *)(*local_48 + lVar9 * 4) = *(float *)(*local_48 + lVar9 * 4) * fVar1;
        lVar9 = lVar9 + 1;
      } while ((local_58 - local_50) + 1 != lVar9);
    }
    break;
  case 0x3ec:
    if (local_50 <= local_58) {
      dVar3 = *scale;
      lVar9 = 0;
      do {
        *(double *)(*local_48 + lVar9 * 8) = *(double *)(*local_48 + lVar9 * 8) * dVar3;
        lVar9 = lVar9 + 1;
      } while ((local_58 - local_50) + 1 != lVar9);
    }
    break;
  case 0x3ee:
    if (local_50 <= local_58) {
      fVar1 = *scale;
      fVar2 = *(float *)((long)scale + 4);
      lVar9 = 0;
      do {
        fVar13 = (float)*(undefined8 *)(*local_48 + lVar9 * 8);
        fVar14 = (float)((ulong)*(undefined8 *)(*local_48 + lVar9 * 8) >> 0x20);
        *(ulong *)(*local_48 + lVar9 * 8) =
             CONCAT44(fVar14 * fVar1 + fVar13 * fVar2,fVar13 * fVar1 + fVar14 * -fVar2);
        lVar9 = lVar9 + 1;
      } while ((local_58 - local_50) + 1 != lVar9);
    }
    break;
  case 0x3ef:
    if (local_50 <= local_58) {
      dVar3 = *scale;
      dVar4 = *(double *)((long)scale + 8);
      lVar9 = (local_58 - local_50) + 1;
      do {
        dVar7 = *(double *)(*local_48 + 8) * dVar3 + *(double *)*local_48 * dVar4;
        auVar6._8_4_ = SUB84(dVar7,0);
        auVar6._0_8_ = *(double *)*local_48 * dVar3 + *(double *)(*local_48 + 8) * -dVar4;
        auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
        *local_48 = auVar6;
        local_48 = local_48 + 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    break;
  case 0x3f8:
    if (local_50 <= local_58) {
      lVar9 = *scale;
      lVar10 = 0;
      do {
        *(long *)(*local_48 + lVar10 * 8) = *(long *)(*local_48 + lVar10 * 8) * lVar9;
        lVar10 = lVar10 + 1;
      } while ((local_58 - local_50) + 1 != lVar10);
    }
  }
  if (local_3c != 0) {
    pnga_pgroup_sync(p_Var8[lVar11].grp);
  }
  return;
}

Assistant:

void pnga_sprs_array_scale(Integer s_a, void *scale)
{
  Integer hdl_a = s_a+GA_OFFSET;
  int local_sync_begin,local_sync_end;
  Integer s_lo, s_hi;
  Integer ld;
  Integer me = pnga_pgroup_nodeid(SPA[hdl_a].grp);
  void *vptr;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl_a].grp);
  pnga_distribution(SPA[hdl_a].g_data,me,&s_lo,&s_hi);
  pnga_access_ptr(SPA[hdl_a].g_data,&s_lo,&s_hi,&vptr,&ld);
  if (SPA[hdl_a].type == C_INT) {
    SPRS_REAL_SCALE_M(int,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_LONG) {
    SPRS_REAL_SCALE_M(long,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_LONGLONG) {
    SPRS_REAL_SCALE_M(long long,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_FLOAT) {
    SPRS_REAL_SCALE_M(float,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_DBL) {
    SPRS_REAL_SCALE_M(double,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_SCPL) {
    SPRS_COMPLEX_SCALE_M(float,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_DCPL) {
    SPRS_COMPLEX_SCALE_M(double,vptr,s_lo,s_hi,scale);
  }

  if (local_sync_end) pnga_pgroup_sync(SPA[hdl_a].grp);
}